

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeclaredType.cpp
# Opt level: O3

ASTContext * __thiscall
slang::ast::DeclaredType::getASTContext<false,slang::ast::ASTContext>
          (ASTContext *__return_storage_ptr__,DeclaredType *this)

{
  uint uVar1;
  undefined1 auVar2 [12];
  ulong uVar3;
  uint uVar4;
  Symbol *symbol;
  ulong uVar5;
  Scope *pSVar6;
  LookupLocation LVar7;
  
  uVar1 = (this->flags).m_bits;
  uVar3 = (ulong)((uVar1 & 0x40) * 2);
  uVar5 = uVar3 + 0x100;
  if ((uVar1 & 0x10) != 0) {
    uVar5 = uVar3;
  }
  symbol = this->parent;
  pSVar6 = symbol->parentScope;
  if (pSVar6 == (Scope *)0x0) {
    assert::assertFailed
              ("scope",
               "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/extern/slang/source/ast/types/DeclaredType.cpp"
               ,0x1c6,
               "T slang::ast::DeclaredType::getASTContext() const [IsInitializer = false, T = slang::ast::ASTContext]"
              );
  }
  if ((uVar1 & 8) == 0) {
    uVar4 = *(uint *)&this->field_0x3c & 0x3fffffff;
    auVar2._8_4_ = uVar4;
    auVar2._0_8_ = pSVar6;
    if (uVar4 != 0) goto LAB_001f9733;
  }
  else {
    if (pSVar6->thisSym->kind != InstanceBody) {
      assert::assertFailed
                ("T::isKind(kind)",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/extern/slang/source/../include/slang/ast/Symbol.h"
                 ,0xc4,
                 "decltype(auto) slang::ast::Symbol::as() [T = slang::ast::InstanceBodySymbol]");
    }
    symbol = *(Symbol **)&pSVar6->thisSym[1].indexInScope;
    if (symbol == (Symbol *)0x0) {
      assert::assertFailed
                ("inst",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/extern/slang/source/ast/types/DeclaredType.cpp"
                 ,0x1ce,
                 "T slang::ast::DeclaredType::getASTContext() const [IsInitializer = false, T = slang::ast::ASTContext]"
                );
    }
    pSVar6 = symbol->parentScope;
    if (pSVar6 == (Scope *)0x0) {
      assert::assertFailed
                ("scope",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/extern/slang/source/ast/types/DeclaredType.cpp"
                 ,0x1d1,
                 "T slang::ast::DeclaredType::getASTContext() const [IsInitializer = false, T = slang::ast::ASTContext]"
                );
    }
  }
  LVar7 = LookupLocation::before(symbol);
  auVar2 = LVar7._0_12_;
LAB_001f9733:
  (__return_storage_ptr__->scope).ptr = pSVar6;
  __return_storage_ptr__->lookupIndex = auVar2._8_4_;
  (__return_storage_ptr__->flags).m_bits =
       uVar5 | ((uVar1 & 0x80) << 0x16 | (uVar1 & 0x4000) << 0xd);
  __return_storage_ptr__->instanceOrProc = (Symbol *)0x0;
  __return_storage_ptr__->firstTempVar = (TempVarSymbol *)0x0;
  __return_storage_ptr__->randomizeDetails = (RandomizeDetails *)0x0;
  __return_storage_ptr__->assertionInstance = (AssertionInstanceDetails *)0x0;
  if (auVar2._0_8_ != pSVar6 && auVar2._0_8_ != (Scope *)0x0) {
    assert::assertFailed
              ("!lookupLocation.getScope() || lookupLocation.getScope() == &scope",
               "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/extern/slang/source/../include/slang/ast/ASTContext.h"
               ,0x119,
               "slang::ast::ASTContext::ASTContext(const Scope &, LookupLocation, bitmask<ASTFlags>)"
              );
  }
  return __return_storage_ptr__;
}

Assistant:

T DeclaredType::getASTContext() const {
    bitmask<ASTFlags> astFlags;
    if (flags.has(DeclaredTypeFlags::NetType))
        astFlags |= ASTFlags::NonProcedural;
    if (!flags.has(DeclaredTypeFlags::AutomaticInitializer))
        astFlags |= ASTFlags::StaticInitializer;
    if (flags.has(DeclaredTypeFlags::CoverageType))
        astFlags |= ASTFlags::AllowCoverageSampleFormal;
    if (flags.has(DeclaredTypeFlags::UserDefinedNetType))
        astFlags |= ASTFlags::AllowNetType;

    const Scope* scope = parent.getParentScope();
    ASSERT(scope);

    // If this type/initializer has been overridden by a parameter override,
    // we should use the instantiation scope and not the parameter's scope
    // when resolving.
    if ((IsInitializer && flags.has(DeclaredTypeFlags::InitializerOverridden)) ||
        (!IsInitializer && flags.has(DeclaredTypeFlags::TypeOverridden))) {
        auto inst = scope->asSymbol().as<InstanceBodySymbol>().parentInstance;
        ASSERT(inst);

        scope = inst->getParentScope();
        ASSERT(scope);

        return ASTContext(*scope, LookupLocation::before(*inst), astFlags);
    }

    // The location depends on whether we are creating the initializer or the type.
    // Initializer lookup happens *after* the parent symbol, so that it can reference
    // the symbol itself. Type lookup happens *before*, since it can't yet see the
    // symbol declaration. There is an exception for parameters, which also can't
    // see its own declaration (which would result in infinite recursion).
    LookupLocation location;
    if (overrideIndex) {
        location = LookupLocation(parent.getParentScope(), overrideIndex);
    }
    else if (IsInitializer) {
        if (flags.has(DeclaredTypeFlags::InitializerCantSeeParent))
            location = LookupLocation::before(parent);
        else
            location = LookupLocation::after(parent);
    }
    else {
        location = LookupLocation::before(parent);
    }

    return ASTContext(*scope, location, astFlags);
}